

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QServ.cpp
# Opt level: O1

bool __thiscall server::QServ::handleTextCommands(QServ *this,clientinfo *ci,char *text)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *text_00;
  int cn;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  char *args [20];
  char ftb [1024];
  char fulltext [1024];
  char *local_8d8 [20];
  char local_838;
  undefined1 auStack_837 [1023];
  char local_438 [1032];
  
  this->m_sender = ci->clientnum;
  setlastCI(this,ci);
  lVar6 = 0;
  memset(&local_838,0,0x400);
  strcpy(&local_838,text);
  pcVar5 = this->m_fulltext;
  strcpy(pcVar5,&local_838);
  if (*text == this->m_cmdprefix) {
    text_00 = " ";
    pcVar2 = strtok(text," ");
    if (pcVar2 != (char *)0x0) {
      lVar6 = 0;
      do {
        local_8d8[lVar6] = pcVar2;
        text_00 = " ";
        pcVar2 = strtok((char *)0x0," ");
        lVar6 = lVar6 + 1;
      } while (pcVar2 != (char *)0x0);
    }
    uVar1 = getCommand(this,text_00,local_8d8);
    pcVar2 = colorname(ci);
    out(2,"%s issued: %s",pcVar2,pcVar5);
    if ((int)uVar1 < 0) {
      cn = ci->clientnum;
      pcVar5 = "\f3Error: Command not found. Use \f2\"#help\" \f3for a list of commands.";
    }
    else {
      sVar3 = strlen(&local_838);
      sVar4 = strlen(local_8d8[0]);
      memcpy(local_438,auStack_837 + sVar4,sVar3 + 1);
      strcpy(pcVar5,local_438);
      if (this->m_command[uVar1].priv <= ci->privilege) {
        bVar7 = true;
        if (this->m_command[uVar1].hasargs == true) {
          bVar7 = this->m_command[uVar1].args == (int)lVar6;
        }
        this->m_lastSA = bVar7;
        (*this->m_command[uVar1].func)(uVar1,local_8d8,(int)lVar6);
        return false;
      }
      cn = ci->clientnum;
      pcVar5 = "\f3Insufficient permission";
    }
    sendf(cn,1,"ris",0x23,pcVar5);
  }
  else {
    sVar3 = strlen(&local_838);
    if ((sVar3 < 0x400) && (bVar7 = ircBot::isConnected(&irc), bVar7)) {
      ircBot::speak(&irc,"%s(%d): %s\r\n",ci->name,(ulong)(uint)ci->clientnum,&local_838);
      printf("%s(%d): %s\r\n",ci->name,(ulong)(uint)ci->clientnum,&local_838);
    }
  }
  return false;
}

Assistant:

bool QServ::handleTextCommands(clientinfo *ci, char *text) {
        setSender(ci->clientnum);
        setlastCI(ci);
        
        char ftb[1024] = {0};
        
        sprintf(ftb, "%s", text);
        setFullText(ftb);
        
        if(isCommand(text)) {
            char *args[20];
            
            
            int argc = 0;
            char *token = 0;
            
            token = strtok(text, " ");
            while(token != NULL) {
                args[argc] = token;
                token = strtok(NULL, " ");
                argc++;
            }
            
            int command = getCommand(0, args);
            out(ECHO_CONSOLE, "%s issued: %s",colorname(ci), getFullText());
            if(command >= 0) {
                
                char fulltext[1024];
                for(int j = 0; j <= strlen(ftb); j++) {
                    fulltext[j] = ftb[j+strlen(args[0])+1];
                }
                setFullText(fulltext);
                
                bool fargs = false;
                if(ci->privilege >= getCommandPriv(command)) {
                    if(commandHasArgs(command)) {
                        if(getCommandArgCount(command) == argc) {
                            fargs = true;
                        } else {
                            fargs = false;
                        }
                    } else {
                        fargs = true;
                    }
                    
                    setlastSA(fargs);
                    exeCommand(command, args, argc);
                    return false;
                } else {
                    sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f3Insufficient permission");
                    return false;
                }
            } else {
                sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f3Error: Command not found. Use \f2\"#help\" \f3for a list of commands.");
                return false;
            }
        } else {
            
            if(strlen(ftb) < 1024 && irc.isConnected()) {
                irc.speak("%s(%d): %s\r\n", ci->name, ci->clientnum, ftb);
                printf("%s(%d): %s\r\n", ci->name, ci->clientnum, ftb);
            } else {
                //disconnect_client(ci->clientnum, DISC_OVERFLOW);
            }
            //checkoLang(ci->clientnum, text);
        }
        //memset(ftb,'\0',1000);
        
        return false;
    }